

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.cpp
# Opt level: O2

TExecutionResult
Refal2::COperationsExecuter::Run
          (CProgramPtr *program,CReceptaclePtr *receptacle,CUnitList *fieldOfView,
          CUnitNode **errorCall)

{
  COperationsExecuter executer;
  __shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2> _Stack_108;
  __shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2> local_f8;
  COperationsExecuter local_e8;
  
  std::__shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f8,&program->super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_108,
             &receptacle->super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>);
  COperationsExecuter(&local_e8,(CProgramPtr *)&local_f8,(CReceptaclePtr *)&_Stack_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_108._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
  CNodeList<Refal2::CUnit>::Move
            (&local_e8.fieldOfView.super_CNodeList<Refal2::CUnit>,
             &fieldOfView->super_CNodeList<Refal2::CUnit>);
  *errorCall = (CUnitNode *)local_e8.initialLeftBracket.super_CUnit.field_1;
  ~COperationsExecuter(&local_e8);
  return local_e8.super_CExecutionContext._60_4_;
}

Assistant:

TExecutionResult COperationsExecuter::Run( CProgramPtr program,
	CReceptaclePtr receptacle, CUnitList& fieldOfView, CUnitNode*& errorCall )
{
	COperationsExecuter executer( program, receptacle );
	executer.fieldOfView.Move( fieldOfView );
	errorCall = executer.initialLeftBracket.PairedParen();
	return executer.executionResult;
}